

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

uint SimpleString::AtoU(char *str)

{
  bool bVar1;
  bool bVar2;
  char *in_RDI;
  uint result;
  uint local_c;
  char *local_8;
  
  local_8 = in_RDI;
  while (bVar1 = isSpace(*local_8), bVar1) {
    local_8 = local_8 + 1;
  }
  local_c = 0;
  while( true ) {
    bVar2 = isDigit(*local_8);
    bVar1 = false;
    if (bVar2) {
      bVar1 = '/' < *local_8;
    }
    if (!bVar1) break;
    local_c = *local_8 + -0x30 + local_c * 10;
    local_8 = local_8 + 1;
  }
  return local_c;
}

Assistant:

unsigned SimpleString::AtoU(const char* str)
{
    while (isSpace(*str)) str++;

    unsigned result = 0;
    for(; isDigit(*str) && *str >= '0'; str++)
    {
        result *= 10;
        result += static_cast<unsigned>(*str - '0');
    }
    return result;
}